

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetIntegerv(void)

{
  ALenum param_00;
  uint32 numvals_00;
  int32 iVar1;
  ALint *origvalues_00;
  ALint *local_260;
  uint local_254;
  ALboolean isenum;
  ALsizei i;
  ALint *values;
  uint32 numvals;
  ALint *origvalues;
  undefined1 local_230 [4];
  ALenum param;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    param_00 = IO_ENUM();
    origvalues_00 = (ALint *)IO_PTR();
    numvals_00 = IO_UINT32();
    if (numvals_00 == 0) {
      local_260 = (ALint *)0x0;
    }
    else {
      local_260 = (ALint *)get_ioblob((ulong)numvals_00 << 2);
    }
    for (local_254 = 0; local_254 < numvals_00; local_254 = local_254 + 1) {
      iVar1 = IO_INT32();
      local_260[(int)local_254] = iVar1;
    }
    if (io_failure == 0) {
      visit_alGetIntegerv((CallerInfo *)local_230,param_00,origvalues_00,numvals_00,
                          param_00 == 0xd000,local_260);
    }
  }
  return;
}

Assistant:

static void decode_alGetIntegerv(void)
{
    IO_START(alGetIntegerv);
    const ALenum param = IO_ENUM();
    ALint *origvalues = (ALint *) IO_PTR();
    const uint32 numvals = IO_UINT32();
    ALint *values = (ALint *) (numvals ? get_ioblob(numvals * sizeof (ALint)) : NULL);
    ALsizei i;
    ALboolean isenum = AL_FALSE;

    for (i = 0; i < numvals; i++) {
        values[i] = IO_INT32();
    }

    switch (param) {
        case AL_DISTANCE_MODEL: isenum = AL_TRUE; break;
        default: break;
    }

    if (!io_failure) visit_alGetIntegerv(&callerinfo, param, origvalues, numvals, isenum, values);

    IO_END();
}